

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O3

void try_merge(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
              TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,PC_TREE *pc_tree,
              PARTITION_TYPE partition,BLOCK_SIZE subsize,int pl)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  PC_TREE *pPVar4;
  int x;
  long lVar5;
  PICK_MODE_CONTEXT *pPVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint mi_row_00;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int i;
  ulong uVar13;
  int i_1;
  long lVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int *in_stack_fffffffffffffda8;
  long local_218;
  RD_STATS block_rdc;
  RD_STATS none_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  bVar15 = ((cpi->common).seq_params)->monochrome == '\0';
  iVar11 = bVar15 + 1 + (uint)bVar15;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  none_rdc.rate = 0x7fffffff;
  none_rdc.zero_rate = 0;
  none_rdc.dist = 0x7fffffffffffffff;
  none_rdc.rdcost = 0x7fffffffffffffff;
  none_rdc.sse = 0x7fffffffffffffff;
  none_rdc.skip_txfm = '\0';
  av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar11);
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  pc_tree->partitioning = '\0';
  if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
    pPVar6 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
    pc_tree->none = pPVar6;
    if (pPVar6 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  else {
    av1_reset_pmc(pc_tree->none);
  }
  uVar2 = (uint)(bVar1 >> 1);
  pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&none_rdc,bsize,pc_tree->none);
  lVar7 = (long)none_rdc.rate + (long)(td->mb).mode_costs.partition_cost[pl][0];
  none_rdc.rate = (int)lVar7;
  none_rdc.rdcost = none_rdc.dist * 0x80 + ((td->mb).rdmult * lVar7 + 0x100 >> 9);
  av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar11);
  iVar12 = (cpi->sf).rt_sf.nonrd_check_partition_merge_mode;
  if ((none_rdc.skip_txfm == '\x01' && 1 < iVar12) && ((pc_tree->none->mic).mode != '\x10'))
  goto LAB_001e67de;
  iVar3 = (cpi->common).quant_params.base_qindex;
  if (bsize < BLOCK_32X64 || iVar12 != 3) {
    if ((1 < iVar12) && (bVar15 = true, (cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN)) {
LAB_001e6293:
      if (none_rdc.skip_txfm == '\0' || (*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7) - 1 < 2)
      goto LAB_001e62be;
      if ((iVar3 != 0 && ((cpi->oxcf).rc_cfg.mode == AOM_CBR && BLOCK_32X16 < bsize)) &&
         ((cpi->oxcf).use_highbitdepth == false && 100 < iVar3)) {
        if (!(bool)((bsize == BLOCK_32X32 && (pc_tree->none->mic).mode == '\x10') & bVar15))
        goto LAB_001e62be;
        if (partition == 0xff) {
          uVar13 = 0xff;
        }
        else {
          uVar13 = (ulong)subsize_lookup[partition][3];
        }
        uVar9 = 0;
        dVar19 = 1.79769313486232e+308;
        dVar17 = 0.0;
        do {
          uVar8 = 0;
          if ((uVar9 & 1) != 0) {
            uVar8 = uVar2;
          }
          iVar12 = (uVar9 >> 1) * uVar2;
          if (((cpi->common).mi_params.mi_rows <= mi_row + iVar12) ||
             ((cpi->common).mi_params.mi_cols <= (int)(mi_col + uVar8))) goto LAB_001e67b0;
          iVar3 = (td->mb).plane[0].src.stride;
          uVar10 = (ulong)(uint)(iVar12 * 4);
          iVar12 = (td->mb).e_mbd.plane[0].dst.stride;
          uVar8 = (*cpi->ppi->fn_ptr[uVar13].vf)
                            ((td->mb).plane[0].src.buf + (ulong)(uVar8 << 2) + (long)iVar3 * uVar10,
                             iVar3,(td->mb).e_mbd.plane[0].dst.buf +
                                   (ulong)(uVar8 << 2) + (long)iVar12 * uVar10,iVar12,
                             (uint *)&block_rdc);
          dVar16 = SQRT(((double)uVar8 / (double)block_size_wide[uVar13]) /
                        (double)block_size_high[uVar13]);
          dVar18 = dVar16;
          if (dVar19 <= dVar16) {
            dVar18 = dVar19;
          }
          if (dVar16 <= dVar17) {
            dVar16 = dVar17;
          }
          uVar9 = uVar9 + 1;
          dVar19 = dVar18;
          dVar17 = dVar16;
        } while (uVar9 != 4);
        uVar9 = 4;
LAB_001e67b0:
        if ((uVar9 != 4) || (1.5 < dVar17 - dVar19)) goto LAB_001e62c6;
      }
      goto LAB_001e67de;
    }
  }
  else {
    bVar15 = bsize < BLOCK_64X128 && 100 < iVar3;
    if ((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN) goto LAB_001e6293;
LAB_001e62be:
    if (!bVar15) {
LAB_001e67de:
      if (none_rdc.rdcost == 0x7fffffffffffffff) goto LAB_001e67fb;
      goto LAB_001e692e;
    }
  }
LAB_001e62c6:
  uVar9 = (td->mb).mode_costs.partition_cost[pl][3];
  uVar13 = 0;
  lVar7 = 0;
  local_218 = 0;
  do {
    block_rdc.rate = 0x7fffffff;
    block_rdc.zero_rate = 0;
    block_rdc.dist = 0x7fffffffffffffff;
    block_rdc.rdcost = 0x7fffffffffffffff;
    block_rdc.sse = 0x7fffffffffffffff;
    block_rdc.skip_txfm = '\0';
    uVar8 = 0;
    if ((uVar13 & 1) != 0) {
      uVar8 = uVar2;
    }
    mi_row_00 = ((uint)(uVar13 >> 1) & 0x7fffffff) * uVar2 + mi_row;
    if (((int)mi_row_00 < (cpi->common).mi_params.mi_rows) &&
       (iVar12 = uVar8 + mi_col, iVar12 < (cpi->common).mi_params.mi_cols)) {
      (td->mb).e_mbd.above_txfm_context =
           (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] +
           (ulong)uVar8 + (long)mi_col;
      (td->mb).e_mbd.left_txfm_context =
           (td->mb).e_mbd.left_txfm_context_buffer + (mi_row_00 & 0x1f);
      pPVar6 = pc_tree->split[uVar13]->none;
      if (pPVar6 == (PICK_MODE_CONTEXT *)0x0) {
        pPVar6 = av1_alloc_pmc(cpi,subsize,&td->shared_coeff_buf);
        pc_tree->split[uVar13]->none = pPVar6;
        if (pc_tree->split[uVar13]->none == (PICK_MODE_CONTEXT *)0x0) {
          aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
        }
      }
      else {
        av1_reset_pmc(pPVar6);
      }
      pPVar4 = pc_tree->split[uVar13];
      pPVar4->partitioning = '\0';
      pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row_00,iVar12,&block_rdc,subsize,pPVar4->none);
      uVar8 = uVar9 + block_rdc.rate;
      uVar9 = 0x7fffffff;
      if ((uVar8 == 0x7fffffff) || (lVar14 = lVar7 + block_rdc.dist, lVar14 == 0x7fffffffffffffff))
      {
        local_218 = 0x7fffffffffffffff;
        lVar7 = 0x7fffffffffffffff;
      }
      else {
        bVar15 = local_218 != 0x7fffffffffffffff;
        local_218 = 0x7fffffffffffffff;
        lVar7 = 0x7fffffffffffffff;
        if (bVar15) {
          lVar5 = (long)(td->mb).rdmult;
          lVar7 = lVar14;
          uVar9 = uVar8;
          if ((int)uVar8 < 0) {
            local_218 = lVar14 * 0x80 - ((long)(lVar5 * (ulong)-uVar8 + 0x100) >> 9);
          }
          else {
            local_218 = lVar14 * 0x80 + ((long)(lVar5 * (ulong)uVar8 + 0x100) >> 9);
          }
        }
      }
      if ((none_rdc.rdcost < local_218) || (uVar13 == 3)) break;
      encode_b_nonrd(cpi,tile_data,td,tp,mi_row_00,iVar12,'\x01',subsize,'\0',
                     pc_tree->split[uVar13]->none,in_stack_fffffffffffffda8);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar11);
  if (lVar7 * 0x80 + ((long)(td->mb).rdmult * (long)(int)uVar9 + 0x100 >> 9) <= none_rdc.rdcost) {
LAB_001e67fb:
    (*mib)->bsize = subsize;
    pc_tree->partitioning = '\x03';
    (td->mb).reuse_inter_pred = false;
    uVar13 = 0;
    do {
      iVar11 = ((uint)(uVar13 >> 1) & 0x7fffffff) * uVar2 + mi_row;
      if (iVar11 < (cpi->common).mi_params.mi_rows) {
        uVar9 = 0;
        if ((uVar13 & 1) != 0) {
          uVar9 = uVar2;
        }
        if ((int)(uVar9 + mi_col) < (cpi->common).mi_params.mi_cols) {
          pPVar6 = pc_tree->split[uVar13]->none;
          if (pPVar6 == (PICK_MODE_CONTEXT *)0x0) {
            pPVar6 = av1_alloc_pmc(cpi,subsize,&td->shared_coeff_buf);
            pc_tree->split[uVar13]->none = pPVar6;
            pPVar6 = pc_tree->split[uVar13]->none;
            if (pPVar6 == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
              pPVar6 = pc_tree->split[uVar13]->none;
            }
          }
          encode_b_nonrd(cpi,tile_data,td,tp,iVar11,uVar9 + mi_col,'\0',subsize,'\0',pPVar6,
                         in_stack_fffffffffffffda8);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 4);
    return;
  }
  (td->mb).reuse_inter_pred = false;
LAB_001e692e:
  (*mib)->bsize = bsize;
  pc_tree->partitioning = '\0';
  encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',bsize,partition,pc_tree->none,
                 in_stack_fffffffffffffda8);
  return;
}

Assistant:

static void try_merge(AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, MB_MODE_INFO **mib,
                      TokenExtra **tp, const int mi_row, const int mi_col,
                      const BLOCK_SIZE bsize, PC_TREE *const pc_tree,
                      const PARTITION_TYPE partition, const BLOCK_SIZE subsize,
                      const int pl) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int num_planes = av1_num_planes(cm);
  // Only square blocks from 8x8 to 128x128 are supported
  assert(bsize >= BLOCK_8X8 && bsize <= BLOCK_128X128);
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  bool do_split = false;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS split_rdc, none_rdc;
  av1_invalid_rd_stats(&split_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  pc_tree->partitioning = PARTITION_NONE;
  if (!pc_tree->none) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  } else {
    av1_reset_pmc(pc_tree->none);
  }
  pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &none_rdc, bsize,
                      pc_tree->none);
  none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
  none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (cpi->sf.rt_sf.nonrd_check_partition_merge_mode < 2 ||
      none_rdc.skip_txfm != 1 || pc_tree->none->mic.mode == NEWMV) {
    do_split = calc_do_split_flag(cpi, x, pc_tree, &none_rdc, mi_params, mi_row,
                                  mi_col, hbs, bsize, partition);
    if (do_split) {
      av1_init_rd_stats(&split_rdc);
      split_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        RD_STATS block_rdc;
        av1_invalid_rd_stats(&block_rdc);
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;
        xd->above_txfm_context =
            cm->above_contexts.txfm[tile_info->tile_row] + mi_col + x_idx;
        xd->left_txfm_context =
            xd->left_txfm_context_buffer + ((mi_row + y_idx) & MAX_MIB_MASK);
        if (!pc_tree->split[i]->none) {
          pc_tree->split[i]->none =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->split[i]->none)
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->split[i]->none);
        }
        pc_tree->split[i]->partitioning = PARTITION_NONE;
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx,
                            &block_rdc, subsize, pc_tree->split[i]->none);
        // TODO(yunqingwang): The rate here did not include the cost of
        // signaling PARTITION_NONE token in the sub-blocks.
        split_rdc.rate += block_rdc.rate;
        split_rdc.dist += block_rdc.dist;

        av1_rd_cost_update(x->rdmult, &split_rdc);

        if (none_rdc.rdcost < split_rdc.rdcost) {
          break;
        }

        if (i != SUB_PARTITIONS_SPLIT - 1)
          encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx,
                         1, subsize, PARTITION_NONE, pc_tree->split[i]->none,
                         NULL);
      }
      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      split_rdc.rdcost = RDCOST(x->rdmult, split_rdc.rate, split_rdc.dist);
    }
  }

  if (none_rdc.rdcost < split_rdc.rdcost) {
    /* Predicted samples can not be reused for PARTITION_NONE since same
     * buffer is being used to store the reconstructed samples of
     * PARTITION_SPLIT block. */
    if (do_split) x->reuse_inter_pred = false;

    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, bsize, partition,
                   pc_tree->none, NULL);
  } else {
    mib[0]->bsize = subsize;
    pc_tree->partitioning = PARTITION_SPLIT;
    /* Predicted samples can not be reused for PARTITION_SPLIT since same
     * buffer is being used to write the reconstructed samples. */
    // TODO(Cherma): Store and reuse predicted samples generated by
    // encode_b_nonrd() in DRY_RUN_NORMAL mode.
    x->reuse_inter_pred = false;

    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      // Note: We don't reset pc_tree->split[i]->none here because it
      // could contain results from the additional check. Instead, it is
      // reset before we enter the nonrd_check_partition_merge_mode
      // condition.
      if (!pc_tree->split[i]->none) {
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->split[i]->none)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx, 0,
                     subsize, PARTITION_NONE, pc_tree->split[i]->none, NULL);
    }
  }
}